

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O1

int __thiscall ncnn::DeconvolutionDepthWise::load_model(DeconvolutionDepthWise *this,ModelBin *mb)

{
  Mat *pMVar1;
  int *piVar2;
  void *pvVar3;
  Allocator *pAVar4;
  int iVar5;
  void *local_68;
  int *piStack_60;
  size_t local_58;
  int local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  size_t local_30;
  
  (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->weight_data_size,0);
  pMVar1 = &this->weight_data;
  if (pMVar1 != (Mat *)&local_68) {
    if (piStack_60 != (int *)0x0) {
      LOCK();
      *piStack_60 = *piStack_60 + 1;
      UNLOCK();
    }
    piVar2 = (this->weight_data).refcount;
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar3 = (this->weight_data).data;
        pAVar4 = (this->weight_data).allocator;
        if (pAVar4 == (Allocator *)0x0) {
          if (pvVar3 != (void *)0x0) {
            free(pvVar3);
          }
        }
        else {
          (**(code **)(*(long *)pAVar4 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
    *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
    pMVar1->data = (void *)0x0;
    (this->weight_data).refcount = (int *)0x0;
    (this->weight_data).dims = 0;
    (this->weight_data).w = 0;
    (this->weight_data).h = 0;
    (this->weight_data).c = 0;
    (this->weight_data).cstep = 0;
    (this->weight_data).data = local_68;
    (this->weight_data).refcount = piStack_60;
    (this->weight_data).elemsize = local_58;
    (this->weight_data).elempack = local_50;
    (this->weight_data).allocator = local_48;
    (this->weight_data).dims = local_40;
    (this->weight_data).w = iStack_3c;
    (this->weight_data).h = iStack_38;
    (this->weight_data).c = iStack_34;
    (this->weight_data).cstep = local_30;
  }
  if (piStack_60 != (int *)0x0) {
    LOCK();
    *piStack_60 = *piStack_60 + -1;
    UNLOCK();
    if (*piStack_60 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_68 != (void *)0x0) {
          free(local_68);
        }
      }
      else {
        (**(code **)(*(long *)local_48 + 0x18))();
      }
    }
  }
  iVar5 = -100;
  if ((pMVar1->data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (*mb->_vptr_ModelBin[2])(&local_68,mb,(ulong)(uint)this->num_output,1);
      pMVar1 = &this->bias_data;
      if (pMVar1 != (Mat *)&local_68) {
        if (piStack_60 != (int *)0x0) {
          LOCK();
          *piStack_60 = *piStack_60 + 1;
          UNLOCK();
        }
        piVar2 = (this->bias_data).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar3 = (this->bias_data).data;
            pAVar4 = (this->bias_data).allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pvVar3 != (void *)0x0) {
                free(pvVar3);
              }
            }
            else {
              (**(code **)(*(long *)pAVar4 + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)&(this->bias_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->bias_data).elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->bias_data).refcount = (int *)0x0;
        (this->bias_data).dims = 0;
        (this->bias_data).w = 0;
        (this->bias_data).h = 0;
        (this->bias_data).c = 0;
        (this->bias_data).cstep = 0;
        (this->bias_data).data = local_68;
        (this->bias_data).refcount = piStack_60;
        (this->bias_data).elemsize = local_58;
        (this->bias_data).elempack = local_50;
        (this->bias_data).allocator = local_48;
        (this->bias_data).dims = local_40;
        (this->bias_data).w = iStack_3c;
        (this->bias_data).h = iStack_38;
        (this->bias_data).c = iStack_34;
        (this->bias_data).cstep = local_30;
      }
      if (piStack_60 != (int *)0x0) {
        LOCK();
        *piStack_60 = *piStack_60 + -1;
        UNLOCK();
        if (*piStack_60 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_68 != (void *)0x0) {
              free(local_68);
            }
          }
          else {
            (**(code **)(*(long *)local_48 + 0x18))();
          }
        }
      }
      if (pMVar1->data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

int DeconvolutionDepthWise::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}